

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  anon_struct_48_6_3c0fcae0 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_50;
  undefined8 local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_68 = 0;
  sStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 6;
  local_20 = (undefined1 *)&local_88;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_88 = sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_88 + 0x18) = sVar2;
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_40 = *(undefined8 *)(local_88 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_50);
  sStack_80 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,*(sysbvm_tuple_t *)(local_88 + 0x28),
                         (context->roots).receiverTypeInferenceType,arguments[1]);
  *(sysbvm_tuple_t *)(local_88 + 0x28) = sStack_80;
  local_78 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                       (context,*(sysbvm_tuple_t *)(local_88 + 0x30),(context->roots).symbolType,
                        arguments[1]);
  *(sysbvm_tuple_t *)(local_88 + 0x30) = local_78;
  _Var1 = sysbvm_astNode_isLiteralNode(context,local_78);
  if (!_Var1) {
    sysbvm_error("Expected a literal slot name.");
  }
  local_68 = sysbvm_astLiteralNode_getValue(local_78);
  if (sStack_80 == 0 || (sStack_80 & 0xf) != 0) {
    sStack_70 = 0;
  }
  else {
    sStack_70 = *(sysbvm_tuple_t *)(sStack_80 + 0x20);
    if (sStack_70 != 0) goto LAB_00128b49;
  }
  sysbvm_error_assertionFailure
            (
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:4210: assertion failure: gcFrame.analyzedTupleExpressionType"
            );
LAB_00128b49:
  sStack_60 = sysbvm_type_lookupSlot(context,sStack_70,local_68);
  if (sStack_60 != 0) {
    *(sysbvm_tuple_t *)(local_88 + 0x38) = sStack_60;
    sVar2 = sysbvm_typeSlot_getValidReferenceType(context,sStack_60);
    *(sysbvm_tuple_t *)(local_88 + 0x20) = sVar2;
    sysbvm_stackFrame_popRecord(&local_50);
    sysbvm_stackFrame_popRecord(&local_38);
    return local_88;
  }
  sysbvm_error("Type does not have a slot with the specified name.");
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astTupleSlotNamedReferenceAtNode_t *tupleSlotNamedReferenceAtNode;
        sysbvm_tuple_t analyzedTupleExpression;
        sysbvm_tuple_t analyzedNameExpression;
        sysbvm_tuple_t analyzedTupleExpressionType;
        sysbvm_tuple_t slotName;
        sysbvm_tuple_t slot;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.tupleSlotNamedReferenceAtNode = (sysbvm_astTupleSlotNamedReferenceAtNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.tupleSlotNamedReferenceAtNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.tupleSlotNamedReferenceAtNode->super.sourcePosition);

    gcFrame.analyzedTupleExpression = sysbvm_interpreter_analyzeASTWithReceiverTypeWithEnvironment(context, gcFrame.tupleSlotNamedReferenceAtNode->tupleExpression, *environment);
    gcFrame.tupleSlotNamedReferenceAtNode->tupleExpression = gcFrame.analyzedTupleExpression;

    gcFrame.analyzedNameExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.tupleSlotNamedReferenceAtNode->nameExpression, context->roots.symbolType, *environment);
    gcFrame.tupleSlotNamedReferenceAtNode->nameExpression = gcFrame.analyzedNameExpression;

    if(!sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedNameExpression))
        sysbvm_error("Expected a literal slot name.");

    gcFrame.slotName = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
    gcFrame.analyzedTupleExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTupleExpression);
    SYSBVM_ASSERT(gcFrame.analyzedTupleExpressionType);

    gcFrame.slot = sysbvm_type_lookupSlot(context, gcFrame.analyzedTupleExpressionType, gcFrame.slotName);
    if(!gcFrame.slot)
        sysbvm_error("Type does not have a slot with the specified name.");

    gcFrame.tupleSlotNamedReferenceAtNode->boundSlot = gcFrame.slot;
    gcFrame.tupleSlotNamedReferenceAtNode->super.analyzedType = sysbvm_typeSlot_getValidReferenceType(context, gcFrame.slot);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.tupleSlotNamedReferenceAtNode;
}